

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_get_name(exr_const_context_t_conflict ctxt,int part_index,char **out)

{
  long lVar1;
  undefined8 uVar2;
  exr_const_context_t_conflict in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_const_priv_part_t part;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_RDX);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_RDX);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (in_RDX == (exr_const_context_t_conflict)0x0) {
        if (*in_RDI == '\x01') {
          internal_exr_unlock((exr_const_context_t_conflict)0x0);
        }
        local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,3,"NULL output for \'name\'");
      }
      else if (*(long *)(lVar1 + 0x68) == 0) {
        if (*in_RDI == '\x01') {
          internal_exr_unlock(in_RDX);
        }
        local_4 = 0xf;
      }
      else if (*(int *)(*(long *)(lVar1 + 0x68) + 0x14) == 0x13) {
        uVar2 = *(undefined8 *)(*(long *)(*(long *)(lVar1 + 0x68) + 0x18) + 8);
        in_RDX->mode = (char)uVar2;
        in_RDX->version = (char)((ulong)uVar2 >> 8);
        in_RDX->max_name_length = (char)((ulong)uVar2 >> 0x10);
        in_RDX->is_singlepart_tiled = (char)((ulong)uVar2 >> 0x18);
        in_RDX->has_nonimage_data = (char)((ulong)uVar2 >> 0x20);
        in_RDX->is_multipart = (char)((ulong)uVar2 >> 0x28);
        in_RDX->strict_header = (char)((ulong)uVar2 >> 0x30);
        in_RDX->silent_header = (char)((ulong)uVar2 >> 0x38);
        if (*in_RDI == '\x01') {
          internal_exr_unlock(in_RDX);
        }
        local_4 = 0;
      }
      else {
        if (*in_RDI == '\x01') {
          internal_exr_unlock(in_RDX);
        }
        local_4 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'name\'",
                             *(undefined8 *)(*(long *)(lVar1 + 0x68) + 8));
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_name (exr_const_context_t ctxt, int part_index, const char** out)
{
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);
    if (!out)
        return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "NULL output for 'name'"));

    if (part->name)
    {
        if (part->name->type != EXR_ATTR_STRING)
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_FILE_BAD_HEADER,
                "Invalid required attribute type '%s' for 'name'",
                part->name->type_name));
        *out = part->name->string->str;
        return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
    }
    return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_NO_ATTR_BY_NAME);
}